

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O3

int __thiscall
Assimp::FindInvalidDataProcess::ProcessMesh(FindInvalidDataProcess *this,aiMesh *pMesh)

{
  aiVector3D **in;
  bool bVar1;
  ulong uVar2;
  Logger *this_00;
  long lVar3;
  aiVector3D *paVar4;
  uint uVar5;
  aiFace *paVar6;
  uint i;
  ulong uVar7;
  byte bVar8;
  allocator_type local_5a;
  bool local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_59 = pMesh->mNumFaces != 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)pMesh->mNumVertices,&local_59,&local_5a);
  uVar5 = pMesh->mNumFaces;
  if (uVar5 != 0) {
    uVar2 = 0;
    do {
      if (pMesh->mFaces[uVar2].mNumIndices != 0) {
        paVar6 = pMesh->mFaces + uVar2;
        uVar7 = 0;
        do {
          uVar5 = paVar6->mIndices[uVar7];
          bVar8 = (byte)uVar5 & 0x3f;
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          uVar7 = uVar7 + 1;
        } while (uVar7 < paVar6->mNumIndices);
        uVar5 = pMesh->mNumFaces;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar5);
  }
  if ((pMesh->mVertices == (aiVector3D *)0x0) ||
     (bVar1 = ProcessArray<aiVector3t<float>>
                        (&pMesh->mVertices,pMesh->mNumVertices,"positions",&local_58,false,true),
     !bVar1)) {
    if (this->mIgnoreTexCoods == false) {
      uVar2 = 0;
      bVar8 = 0;
      do {
        if (pMesh->mTextureCoords[uVar2] == (aiVector3D *)0x0) break;
        bVar1 = ProcessArray<aiVector3t<float>>
                          (pMesh->mTextureCoords + uVar2,pMesh->mNumVertices,"uvcoords",&local_58,
                           false,true);
        if (bVar1) {
          pMesh->mNumUVComponents[uVar2] = 0;
          bVar8 = 1;
          uVar7 = uVar2;
          if (uVar2 < 7) {
            do {
              if (pMesh->mTextureCoords[uVar7 + 1] != (aiVector3D *)0x0) {
                operator_delete__(pMesh->mTextureCoords[uVar7 + 1]);
              }
              pMesh->mTextureCoords[uVar7 + 1] = (aiVector3D *)0x0;
              pMesh->mNumUVComponents[uVar7 + 1] = 0;
              uVar7 = uVar7 + 1;
            } while (uVar7 != 7);
          }
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != 8);
    }
    else {
      bVar8 = 0;
    }
    paVar4 = pMesh->mNormals;
    if ((paVar4 != (aiVector3D *)0x0) || (pMesh->mTangents != (aiVector3D *)0x0)) {
      if ((pMesh->mPrimitiveTypes & 3) != 0) {
        if ((pMesh->mPrimitiveTypes & 0xc) == 0) goto LAB_003be15e;
        if (pMesh->mNumFaces != 0) {
          lVar3 = 8;
          uVar2 = 0;
          do {
            paVar6 = pMesh->mFaces;
            if ((*(uint *)((long)paVar6 + lVar3 + -8) < 3) &&
               (uVar5 = **(uint **)((long)&paVar6->mNumIndices + lVar3),
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] =
                    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] |
                    1L << ((byte)uVar5 & 0x3f), *(int *)((long)paVar6 + lVar3 + -8) == 2)) {
              uVar5 = *(uint *)(*(long *)((long)&paVar6->mNumIndices + lVar3) + 4);
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] |
                   1L << ((byte)uVar5 & 0x3f);
            }
            uVar2 = uVar2 + 1;
            lVar3 = lVar3 + 0x10;
          } while (uVar2 < pMesh->mNumFaces);
          paVar4 = pMesh->mNormals;
        }
      }
      if ((paVar4 != (aiVector3D *)0x0) &&
         (bVar1 = ProcessArray<aiVector3t<float>>
                            (&pMesh->mNormals,pMesh->mNumVertices,"normals",&local_58,true,false),
         bVar1)) {
        bVar8 = 1;
      }
      in = &pMesh->mTangents;
      if ((pMesh->mTangents != (aiVector3D *)0x0) &&
         (bVar1 = ProcessArray<aiVector3t<float>>
                            (in,pMesh->mNumVertices,"tangents",&local_58,false,true), bVar1)) {
        if (pMesh->mBitangents != (aiVector3D *)0x0) {
          operator_delete__(pMesh->mBitangents);
        }
        pMesh->mBitangents = (aiVector3D *)0x0;
        bVar8 = 1;
      }
      if ((pMesh->mBitangents != (aiVector3D *)0x0) &&
         (bVar1 = ProcessArray<aiVector3t<float>>
                            (&pMesh->mBitangents,pMesh->mNumVertices,"bitangents",&local_58,false,
                             true), bVar1)) {
        if (*in != (aiVector3D *)0x0) {
          operator_delete__(*in);
        }
        *in = (aiVector3D *)0x0;
        bVar8 = 1;
      }
    }
  }
  else {
    this_00 = DefaultLogger::get();
    bVar8 = 2;
    Logger::error(this_00,"Deleting mesh: Unable to continue without vertex positions");
  }
LAB_003be15e:
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (int)bVar8;
}

Assistant:

int FindInvalidDataProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;
    std::vector<bool> dirtyMask(pMesh->mNumVertices, pMesh->mNumFaces != 0);

    // Ignore elements that are not referenced by vertices.
    // (they are, for example, caused by the FindDegenerates step)
    for (unsigned int m = 0; m < pMesh->mNumFaces; ++m) {
        const aiFace& f = pMesh->mFaces[m];

        for (unsigned int i = 0; i < f.mNumIndices; ++i) {
            dirtyMask[f.mIndices[i]] = false;
        }
    }

    // Process vertex positions
    if (pMesh->mVertices && ProcessArray(pMesh->mVertices, pMesh->mNumVertices, "positions", dirtyMask)) {
        ASSIMP_LOG_ERROR("Deleting mesh: Unable to continue without vertex positions");

        return 2;
    }

    // process texture coordinates
    if (!mIgnoreTexCoods) {
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS && pMesh->mTextureCoords[i]; ++i) {
            if (ProcessArray(pMesh->mTextureCoords[i], pMesh->mNumVertices, "uvcoords", dirtyMask)) {
                pMesh->mNumUVComponents[i] = 0;

                // delete all subsequent texture coordinate sets.
                for (unsigned int a = i + 1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
                    delete[] pMesh->mTextureCoords[a];
                    pMesh->mTextureCoords[a] = NULL;
                    pMesh->mNumUVComponents[a] = 0;
                }

                ret = true;
            }
        }
    }

    // -- we don't validate vertex colors, it's difficult to say whether
    // they are invalid or not.

    // Normals and tangents are undefined for point and line faces.
    if (pMesh->mNormals || pMesh->mTangents)    {

        if (aiPrimitiveType_POINT & pMesh->mPrimitiveTypes ||
            aiPrimitiveType_LINE  & pMesh->mPrimitiveTypes)
        {
            if (aiPrimitiveType_TRIANGLE & pMesh->mPrimitiveTypes ||
                aiPrimitiveType_POLYGON  & pMesh->mPrimitiveTypes)
            {
                // We need to update the lookup-table
                for (unsigned int m = 0; m < pMesh->mNumFaces;++m) {
                    const aiFace& f = pMesh->mFaces[ m ];

                    if (f.mNumIndices < 3)  {
                        dirtyMask[f.mIndices[0]] = true;
                        if (f.mNumIndices == 2) {
                            dirtyMask[f.mIndices[1]] = true;
                        }
                    }
                }
            }
            // Normals, tangents and bitangents are undefined for
            // the whole mesh (and should not even be there)
            else {
                return ret;
            }
        }

        // Process mesh normals
        if (pMesh->mNormals && ProcessArray(pMesh->mNormals,pMesh->mNumVertices,
            "normals",dirtyMask,true,false))
            ret = true;

        // Process mesh tangents
        if (pMesh->mTangents && ProcessArray(pMesh->mTangents,pMesh->mNumVertices,"tangents",dirtyMask))    {
            delete[] pMesh->mBitangents; pMesh->mBitangents = NULL;
            ret = true;
        }

        // Process mesh bitangents
        if (pMesh->mBitangents && ProcessArray(pMesh->mBitangents,pMesh->mNumVertices,"bitangents",dirtyMask))  {
            delete[] pMesh->mTangents; pMesh->mTangents = NULL;
            ret = true;
        }
    }
    return ret ? 1 : 0;
}